

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestApprovals.h
# Opt level: O0

void __thiscall
ApprovalTests::anon_unknown_1::DocTestApprovalListener::subcase_start
          (DocTestApprovalListener *this,SubcaseSignature *signature)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  string local_30 [16];
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30;
  (anonymous_namespace)::DocTestApprovalListener::doctestToString_abi_cxx11_
            ((DocTestApprovalListener *)in_stack_ffffffffffffffe8,
             (String *)in_stack_ffffffffffffffe0);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(in_stack_ffffffffffffffc0,__args);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void subcase_start(const doctest::SubcaseSignature& signature) override
            {
                currentTest.sections.emplace_back(doctestToString(signature.m_name));
            }